

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generation_iterator.cpp
# Opt level: O1

generation_iterator * __thiscall pstore::generation_iterator::operator++(generation_iterator *this)

{
  _func_int **local_20;
  unique_ptr<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  local_18;
  
  database::getro<pstore::trailer,void>
            ((database *)&stack0xffffffffffffffe0,(typed_address<pstore::trailer>)this->db_,
             (this->pos_).a_.a_);
  (this->pos_).a_.a_ = (value_type)local_20[4];
  if ((tuple<std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
       )local_18._M_t.
        super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
        .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl !=
      (_Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_18._M_t.
               super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
               .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl)
    ;
  }
  trailer::validate(this->db_,(typed_address<pstore::trailer>)(this->pos_).a_.a_);
  return this;
}

Assistant:

generation_iterator & generation_iterator::operator++ () {
        pos_ = db_->getro<pstore::trailer> (pos_)->a.prev_generation;
        this->validate ();
        return *this;
    }